

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::WindowDataParameter::Clear(WindowDataParameter *this)

{
  uint uVar1;
  LogMessage *pLVar2;
  string *psVar3;
  LogFinisher local_49;
  LogMessage local_48;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar3 = (this->source_).ptr_;
      if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_48,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x97c1);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_48,
                            "CHECK failed: !source_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_49,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_48);
        psVar3 = (this->source_).ptr_;
      }
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 2) != 0) {
      psVar3 = (this->mean_file_).ptr_;
      if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_48,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x97c5);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_48,
                            "CHECK failed: !mean_file_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_49,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_48);
        psVar3 = (this->mean_file_).ptr_;
      }
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 4) != 0) {
      psVar3 = (this->crop_mode_).ptr_;
      if (psVar3 == (string *)&_default_crop_mode__abi_cxx11_) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_48,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x97c9);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_48,
                            "CHECK failed: !crop_mode_.IsDefault(&WindowDataParameter::_default_crop_mode_.get()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_49,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_48);
        psVar3 = (this->crop_mode_).ptr_;
      }
      std::__cxx11::string::_M_assign((string *)psVar3);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 8) != 0) {
      psVar3 = (this->root_folder_).ptr_;
      if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_48,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x97cd);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_48,
                            "CHECK failed: !root_folder_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_49,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_48);
        psVar3 = (this->root_folder_).ptr_;
      }
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
  }
  if ((uVar1 & 0xf0) != 0) {
    this->mirror_ = false;
    this->cache_images_ = false;
    this->batch_size_ = 0;
    this->crop_size_ = 0;
  }
  if ((uVar1 & 0x1f00) != 0) {
    this->context_pad_ = 0;
    this->scale_ = 1.0;
    this->fg_threshold_ = 0.5;
    this->bg_threshold_ = 0.5;
    this->fg_fraction_ = 0.25;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void WindowDataParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.WindowDataParameter)
  if (_has_bits_[0 / 32] & 15u) {
    if (has_source()) {
      GOOGLE_DCHECK(!source_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*source_.UnsafeRawStringPointer())->clear();
    }
    if (has_mean_file()) {
      GOOGLE_DCHECK(!mean_file_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*mean_file_.UnsafeRawStringPointer())->clear();
    }
    if (has_crop_mode()) {
      GOOGLE_DCHECK(!crop_mode_.IsDefault(&WindowDataParameter::_default_crop_mode_.get()));
      (*crop_mode_.UnsafeRawStringPointer())->assign(*&WindowDataParameter::_default_crop_mode_.get());
    }
    if (has_root_folder()) {
      GOOGLE_DCHECK(!root_folder_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*root_folder_.UnsafeRawStringPointer())->clear();
    }
  }
  if (_has_bits_[0 / 32] & 240u) {
    ::memset(&batch_size_, 0, reinterpret_cast<char*>(&cache_images_) -
      reinterpret_cast<char*>(&batch_size_) + sizeof(cache_images_));
  }
  if (_has_bits_[8 / 32] & 7936u) {
    context_pad_ = 0u;
    scale_ = 1;
    fg_threshold_ = 0.5f;
    bg_threshold_ = 0.5f;
    fg_fraction_ = 0.25f;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}